

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

void libtorrent::detail::escape_string(string *ret,char *str,int len)

{
  char local_25 [5];
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char tmp [5];
  int i;
  int len_local;
  char *str_local;
  string *ret_local;
  
  cStack_20 = '\0';
  cStack_1f = '\0';
  cStack_1e = '\0';
  tmp[0] = '\0';
  tmp._1_4_ = len;
  for (; _cStack_20 < (int)tmp._1_4_; _cStack_20 = _cStack_20 + 1) {
    if ((str[_cStack_20] < ' ') || ('~' < str[_cStack_20])) {
      snprintf(local_25,5,"\\x%02x",(ulong)(byte)str[_cStack_20]);
      std::__cxx11::string::operator+=((string *)ret,local_25);
    }
    else {
      std::__cxx11::string::operator+=((string *)ret,str[_cStack_20]);
    }
  }
  return;
}

Assistant:

void escape_string(std::string& ret, char const* str, int len)
	{
		for (int i = 0; i < len; ++i)
		{
			if (str[i] >= 32 && str[i] < 127)
			{
				ret += str[i];
			}
			else
			{
				char tmp[5];
				std::snprintf(tmp, sizeof(tmp), "\\x%02x", std::uint8_t(str[i]));
				ret += tmp;
			}
		}
	}